

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::readSequence(Graph *this)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  long lVar3;
  size_type sVar4;
  char c;
  undefined7 uStack_277;
  pointer pcStack_270;
  pointer local_268;
  string base;
  fstream file;
  byte abStack_220 [496];
  
  base._M_dataplus._M_p = (pointer)&base.field_2;
  base._M_string_length = 0;
  base.field_2._M_local_buf[0] = '\0';
  std::fstream::fstream(&file,"sample.fasta",_S_in);
  lVar3 = -1;
  while ((abStack_220[*(long *)(_file + -0x18)] & 2) == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&file,(string *)&base)
    ;
    sVar2 = base._M_string_length;
    _Var1 = base._M_dataplus;
    if (*base._M_dataplus._M_p == '>') {
      _c = (pointer)0x0;
      pcStack_270 = (pointer)0x0;
      local_268 = (pointer)0x0;
      std::
      vector<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>
      ::emplace_back<std::vector<char,std::allocator<char>>>
                ((vector<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>
                  *)&this->sequences,(vector<char,_std::allocator<char>_> *)&c);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&c);
      lVar3 = lVar3 + 1;
    }
    else {
      for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
        _c = (pointer)CONCAT71(uStack_277,_Var1._M_p[sVar4]);
        if (_Var1._M_p[sVar4] != ' ') {
          std::vector<char,_std::allocator<char>_>::push_back
                    ((this->sequences).
                     super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar3,(value_type *)&c);
        }
      }
    }
  }
  std::fstream::~fstream(&file);
  std::__cxx11::string::~string((string *)&base);
  return;
}

Assistant:

void Graph::readSequence(){
    string base;
    int row = -1;
    fstream file("sample.fasta", ios::in);
    while(!file.eof()){
        getline(file, base);
        if(base[0] == '>'){
            this->sequences.emplace_back(vector<char>());
            row++;
            continue;
        }else{
            for(auto c : base){
                if(c != ' ')
                    this->sequences[row].push_back(c);
            }
        }
    }
}